

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_hasReturnValue_TestShell::TEST_MockSupport_c_hasReturnValue_TestShell
          (TEST_MockSupport_c_hasReturnValue_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_002d70d8;
  return;
}

Assistant:

TEST(MockSupport_c, hasReturnValue)
{
    mock_c()->expectOneCall("foo");
    CHECK(mock_c()->actualCall("foo")->hasReturnValue() == 0);
    CHECK(mock_c()->hasReturnValue() == 0);

    mock_c()->expectOneCall("foo2")->andReturnIntValue(1);
    CHECK(mock_c()->actualCall("foo2")->hasReturnValue() != 0);
    CHECK(mock_c()->hasReturnValue() != 0);
}